

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<kj::Own<capnp::ClientHook>,kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>>>
::AdapterPromiseNode<kj::_::WeakFulfiller<kj::Own<capnp::ClientHook>>&>
          (AdapterPromiseNode<kj::Own<capnp::ClientHook>,kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>>>
           *this,WeakFulfiller<kj::Own<capnp::ClientHook>_> *params)

{
  WeakFulfiller<kj::Own<capnp::ClientHook>_> *wrapper;
  WeakFulfiller<kj::Own<capnp::ClientHook>_> *params_local;
  AdapterPromiseNode<kj::Own<capnp::ClientHook>,_kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>_>_>
  *this_local;
  
  AdapterPromiseNodeBase::AdapterPromiseNodeBase((AdapterPromiseNodeBase *)this);
  PromiseFulfiller<kj::Own<capnp::ClientHook>_>::PromiseFulfiller
            ((PromiseFulfiller<kj::Own<capnp::ClientHook>_> *)(this + 0x10));
  *(undefined ***)this = &PTR_onReady_00cd5be0;
  *(undefined ***)(this + 0x10) = &PTR_fulfill_00cd5c28;
  ExceptionOr<kj::Own<capnp::ClientHook>_>::ExceptionOr
            ((ExceptionOr<kj::Own<capnp::ClientHook>_> *)(this + 0x18));
  this[0x188] = (AdapterPromiseNode<kj::Own<capnp::ClientHook>,kj::_::PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>>>
                 )0x1;
  wrapper = fwd<kj::_::WeakFulfiller<kj::Own<capnp::ClientHook>>&>(params);
  PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>_>::PromiseAndFulfillerAdapter
            ((PromiseAndFulfillerAdapter<kj::Own<capnp::ClientHook>_> *)(this + 400),
             (PromiseFulfiller<kj::Own<capnp::ClientHook>_> *)(this + 0x10),wrapper);
  return;
}

Assistant:

AdapterPromiseNode(Params&&... params)
      : adapter(static_cast<PromiseFulfiller<UnfixVoid<T>>&>(*this), kj::fwd<Params>(params)...) {}